

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void rcv_thread(int sockfd)

{
  int iVar1;
  int extraout_EAX;
  packet *ppVar2;
  ssize_t sVar3;
  int iVar4;
  int iVar5;
  
  ppVar2 = (packet *)malloc(0x406);
  pckt = ppVar2;
  memset(ppVar2,0,0x406);
  sVar3 = recv(sockfd,ppVar2,0x406,0);
  iVar5 = (int)sVar3;
  while (1 < iVar5 + 1U) {
    iVar4 = -1;
    iVar5 = -1;
    if (typewin != (WINDOW *)0x0) {
      iVar5 = (int)typewin->_cury;
      iVar4 = (int)typewin->_curx;
    }
    wattr_on(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    wprintw(chatwin,"%s: ",pckt);
    wattr_off(chatwin,((ushort)pckt->color & 0xff) << 8,0);
    wprintw(chatwin,"%s\n",pckt->msg);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
    if (iVar1 != 0) goto LAB_001029c4;
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin,iVar5,iVar4);
    pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
    ppVar2 = pckt;
    memset(pckt,0,0x406);
    sVar3 = recv(sockfd,ppVar2,0x406,0);
    iVar5 = (int)sVar3;
  }
  perror("Erro ao receber mensagem\n");
  exit_();
  iVar1 = extraout_EAX;
LAB_001029c4:
  std::__throw_system_error(iVar1);
}

Assistant:

void rcv_thread(int sockfd) {
  pckt = (struct packet*)malloc(PACKET_LEN);

  while(1) {
    memset(pckt, 0, PACKET_LEN);

    int mlen = recv(sockfd, pckt, PACKET_LEN, 0);
    if(mlen == -1 || mlen == 0) {
      perror("Erro ao receber mensagem\n");
      exit_();
    }
    int y,x;

    getyx(typewin, y, x);


    wattron(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s: ", pckt->name);
    wattroff(chatwin, COLOR_PAIR(pckt->color));
    wprintw(chatwin, "%s\n", pckt->msg);

    mutwin.lock();
    wrefresh(chatwin);
    wrefresh(typewin);
    wmove(typewin, y,x);
    mutwin.unlock();
  }
}